

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall
QPDFJob::doProcessOnce
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,
          function<void_(QPDF_*,_const_char_*)> *fn,char *password,bool empty,bool used_for_input,
          bool main_input)

{
  element_type *peVar1;
  undefined1 auVar2 [12];
  QPDF *pQVar3;
  pointer __p;
  char *local_60;
  string local_58;
  char *local_38;
  
  local_38 = password;
  pQVar3 = (QPDF *)operator_new(8);
  QPDF::QPDF(pQVar3);
  auVar2._4_8_ = 0;
  auVar2._0_4_ = (uint)local_58._M_string_length;
  local_58._0_12_ = auVar2 << 0x40;
  std::__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>::reset
            ((__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_> *)pdf,pQVar3);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_58);
  setQPDFOptions(this,(pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  if (empty) {
    QPDF::emptyPDF((pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                   super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  }
  else if ((main_input) &&
          (peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr, peVar1->json_input == true)) {
    pQVar3 = (pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
             super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
             super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               (peVar1->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (allocator<char> *)&local_60);
    QPDF::createFromJSON(pQVar3,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_58._M_dataplus._M_p =
         (pointer)(pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                  super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
    local_60 = local_38;
    if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*fn->_M_invoker)((_Any_data *)fn,(QPDF **)&local_58,&local_60);
  }
  if (used_for_input) {
    peVar1 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58._0_12_ =
         QPDF::getVersionAsPDFVersion
                   ((pdf->_M_t).super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                    super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    PDFVersion::updateIfGreater(&peVar1->max_input_version,(PDFVersion *)&local_58);
  }
  return;
}

Assistant:

void
QPDFJob::doProcessOnce(
    std::unique_ptr<QPDF>& pdf,
    std::function<void(QPDF*, char const*)> fn,
    char const* password,
    bool empty,
    bool used_for_input,
    bool main_input)
{
    pdf = std::make_unique<QPDF>();
    setQPDFOptions(*pdf);
    if (empty) {
        pdf->emptyPDF();
    } else if (main_input && m->json_input) {
        pdf->createFromJSON(m->infilename.get());
    } else {
        fn(pdf.get(), password);
    }
    if (used_for_input) {
        m->max_input_version.updateIfGreater(pdf->getVersionAsPDFVersion());
    }
}